

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e8ba::CpuTest_lax_indirect_indexed_Test::TestBody
          (CpuTest_lax_indirect_indexed_Test *this)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  MockSpec<unsigned_char_(unsigned_short)> *pMVar4;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar5;
  char *message;
  AssertHelper local_1f8;
  Message local_1f0;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar;
  Action<unsigned_char_(unsigned_short)> local_1c8;
  WithoutMatchers local_1a1;
  Matcher<unsigned_short> local_1a0;
  MockSpec<unsigned_char_(unsigned_short)> local_188;
  ReturnAction<int> local_168;
  Action<unsigned_char_(unsigned_short)> local_158;
  WithoutMatchers local_131;
  Matcher<unsigned_short> local_130;
  MockSpec<unsigned_char_(unsigned_short)> local_118;
  ReturnAction<int> local_f8;
  Action<unsigned_char_(unsigned_short)> local_e8;
  WithoutMatchers local_c1;
  Matcher<unsigned_short> local_c0;
  MockSpec<unsigned_char_(unsigned_short)> local_a8;
  ReturnAction<int> local_88;
  Action<unsigned_char_(unsigned_short)> local_78;
  WithoutMatchers local_55 [13];
  Matcher<unsigned_short> local_48;
  MockSpec<unsigned_char_(unsigned_short)> local_30;
  CpuTest_lax_indirect_indexed_Test *local_10;
  CpuTest_lax_indirect_indexed_Test *this_local;
  
  (this->super_CpuTest).expected.pc = 0x4321;
  (this->super_CpuTest).registers.pc = 0x4321;
  (this->super_CpuTest).expected.y = '\r';
  (this->super_CpuTest).registers.y = '\r';
  (this->super_CpuTest).expected.a = 'B';
  (this->super_CpuTest).expected.x = 'B';
  local_10 = this;
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,0xb3);
  uVar1 = (this->super_CpuTest).expected.pc;
  if (!SCARRY4((uint)uVar1,1)) {
    (this->super_CpuTest).expected.pc = uVar1 + 1;
    testing::Matcher<unsigned_short>::Matcher(&local_48,0x4322);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_30,&(this->super_CpuTest).mmu.super_MockMmu,&local_48);
    testing::internal::GetWithoutMatchers();
    pMVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_30,local_55,(void *)0x0);
    pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                        ,0x205,"mmu","read_byte(0x4322)");
    testing::Return<int>((testing *)&local_88,0x42);
    testing::internal::ReturnAction::operator_cast_to_Action(&local_78,(ReturnAction *)&local_88);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar5,&local_78);
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_78);
    testing::internal::ReturnAction<int>::~ReturnAction(&local_88);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_30);
    testing::Matcher<unsigned_short>::~Matcher(&local_48);
    testing::Matcher<unsigned_short>::Matcher(&local_c0,0x42);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_a8,&(this->super_CpuTest).mmu.super_MockMmu,&local_c0);
    testing::internal::GetWithoutMatchers();
    pMVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_a8,&local_c1,(void *)0x0);
    pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                        ,0x206,"mmu","read_byte(0x42)");
    testing::Return<int>((testing *)&local_f8,0x34);
    testing::internal::ReturnAction::operator_cast_to_Action(&local_e8,(ReturnAction *)&local_f8);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar5,&local_e8);
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_e8);
    testing::internal::ReturnAction<int>::~ReturnAction(&local_f8);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_a8);
    testing::Matcher<unsigned_short>::~Matcher(&local_c0);
    testing::Matcher<unsigned_short>::Matcher(&local_130,0x43);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_118,&(this->super_CpuTest).mmu.super_MockMmu,&local_130);
    testing::internal::GetWithoutMatchers();
    pMVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_118,&local_131,(void *)0x0);
    pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                        ,0x207,"mmu","read_byte(0x43)");
    testing::Return<int>((testing *)&local_168,0x12);
    testing::internal::ReturnAction::operator_cast_to_Action(&local_158,(ReturnAction *)&local_168);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar5,&local_158)
    ;
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_158);
    testing::internal::ReturnAction<int>::~ReturnAction(&local_168);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_118);
    testing::Matcher<unsigned_short>::~Matcher(&local_130);
    testing::Matcher<unsigned_short>::Matcher(&local_1a0,0x1241);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_188,&(this->super_CpuTest).mmu.super_MockMmu,&local_1a0);
    testing::internal::GetWithoutMatchers();
    pMVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_188,&local_1a1,(void *)0x0);
    pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                        ,0x209,"mmu","read_byte(0x1234 + 0x0D)");
    testing::Return<int>((testing *)&gtest_ar.message_,0x42);
    testing::internal::ReturnAction::operator_cast_to_Action
              (&local_1c8,(ReturnAction *)&gtest_ar.message_);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar5,&local_1c8)
    ;
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_1c8);
    testing::internal::ReturnAction<int>::~ReturnAction((ReturnAction<int> *)&gtest_ar.message_);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_188);
    testing::Matcher<unsigned_short>::~Matcher(&local_1a0);
    n_e_s::core::test::CpuTest::step_execution(&this->super_CpuTest,'\x05');
    testing::internal::EqHelper::
    Compare<n_e_s::core::CpuRegisters,_n_e_s::core::CpuRegisters,_nullptr>
              ((EqHelper *)local_1e8,"expected","registers",&(this->super_CpuTest).expected,
               &(this->super_CpuTest).registers);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
    if (!bVar3) {
      testing::Message::Message(&local_1f0);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                 ,0x20c,message);
      testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
      testing::internal::AssertHelper::~AssertHelper(&local_1f8);
      testing::Message::~Message(&local_1f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
    return;
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

TEST_F(CpuTest, lax_indirect_indexed) {
    registers.pc = expected.pc = 0x4321;
    registers.y = expected.y = 0x0D;
    expected.a = 0x42;
    expected.x = 0x42;

    stage_instruction(LAX_INDINX);
    expected.pc += 1;

    EXPECT_CALL(mmu, read_byte(0x4322)).WillOnce(Return(0x42));
    EXPECT_CALL(mmu, read_byte(0x42)).WillOnce(Return(0x34));
    EXPECT_CALL(mmu, read_byte(0x43)).WillOnce(Return(0x12));

    EXPECT_CALL(mmu, read_byte(0x1234 + 0x0D)).WillOnce(Return(0x42));
    step_execution(5);

    EXPECT_EQ(expected, registers);
}